

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateBuildDescriptors
          (FileGenerator *this,Printer *printer)

{
  MessageGenerator *this_00;
  pointer puVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  size_type sVar6;
  reference ppMVar7;
  reference pvVar8;
  reference pvVar9;
  char *pcVar10;
  Descriptor *this_01;
  protobuf *this_02;
  string *psVar11;
  string *psVar12;
  reference ppEVar13;
  ulong uVar14;
  undefined1 qualified;
  int i_16;
  int i_17;
  unsigned_long i_18;
  pair<unsigned_long,_unsigned_long> pVar15;
  undefined1 auVar16 [16];
  string local_538;
  undefined1 local_518 [8];
  string file_namespace_1;
  FileDescriptor *dependency_1;
  undefined1 local_4e8 [4];
  int i_15;
  string local_4c8;
  string local_4a8;
  string local_488;
  int local_464;
  undefined1 local_460 [4];
  int i_14;
  string local_440;
  int local_420;
  int local_41c;
  int j;
  int i_13;
  string file_data;
  FileDescriptorProto file_proto;
  int local_318;
  int i_12;
  int i_11;
  int i_10;
  undefined1 local_2f0 [8];
  string file_namespace;
  FileDescriptor *dependency;
  undefined1 local_2c0 [4];
  int i_9;
  uint local_2a0;
  int local_29c;
  int i_8;
  int i_7;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  uint local_1a0;
  allocator<char> local_199;
  int i_6;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  undefined1 local_120 [8];
  string message_factory;
  Descriptor *descriptor;
  int local_d0;
  int i_5;
  int i_4;
  int offset_1;
  unsigned_long local_c0;
  int local_b4;
  undefined1 local_b0 [4];
  int i_3;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  pairs;
  size_t sStack_90;
  int i_2;
  size_t aux_offset;
  size_t offset;
  size_t value_1;
  undefined1 local_70 [4];
  int i_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> aux_entries;
  size_t local_48;
  size_t value;
  long lStack_38;
  int i;
  size_t count;
  vector<unsigned_long,_std::allocator<unsigned_long>_> entries;
  Printer *printer_local;
  FileGenerator *this_local;
  
  entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)printer;
  io::Printer::Print(printer,
                     "PROTOBUF_CONSTEXPR_VAR ::google::protobuf::internal::ParseTableField\n    const TableStruct::entries[] = {\n"
                    );
  io::Printer::Indent((Printer *)
                      entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&count);
  lStack_38 = 0;
  for (value._4_4_ = 0; uVar5 = (ulong)value._4_4_,
      sVar6 = std::
              vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ::size(&this->message_generators_), uVar5 < sVar6; value._4_4_ = value._4_4_ + 1) {
    ppMVar7 = std::
              vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ::operator[](&this->message_generators_,(long)value._4_4_);
    local_48 = MessageGenerator::GenerateParseOffsets
                         (*ppMVar7,(Printer *)
                                   entries.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&count,&local_48);
    lStack_38 = local_48 + lStack_38;
  }
  if (lStack_38 == 0) {
    io::Printer::Print((Printer *)
                       entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                       "{0, 0, 0, ::google::protobuf::internal::kInvalidMask, 0, 0},\n");
  }
  io::Printer::Outdent
            ((Printer *)
             entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  io::Printer::Print((Printer *)
                     entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                     "};\n\nPROTOBUF_CONSTEXPR_VAR ::google::protobuf::internal::AuxillaryParseTableField\n    const TableStruct::aux[] = {\n"
                    );
  io::Printer::Indent((Printer *)
                      entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_70);
  lStack_38 = 0;
  for (value_1._4_4_ = 0; uVar5 = (ulong)value_1._4_4_,
      sVar6 = std::
              vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ::size(&this->message_generators_), uVar5 < sVar6; value_1._4_4_ = value_1._4_4_ + 1)
  {
    ppMVar7 = std::
              vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ::operator[](&this->message_generators_,(long)value_1._4_4_);
    offset = MessageGenerator::GenerateParseAuxTable
                       (*ppMVar7,(Printer *)
                                 entries.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_70,&offset);
    lStack_38 = offset + lStack_38;
  }
  if (lStack_38 == 0) {
    io::Printer::Print((Printer *)
                       entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                       "::google::protobuf::internal::AuxillaryParseTableField(),\n");
  }
  io::Printer::Outdent
            ((Printer *)
             entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  io::Printer::Print((Printer *)
                     entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                     "};\nPROTOBUF_CONSTEXPR_VAR ::google::protobuf::internal::ParseTable const\n    TableStruct::schema[] = {\n"
                    );
  io::Printer::Indent((Printer *)
                      entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  aux_offset = 0;
  sStack_90 = 0;
  for (pairs.
       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      uVar5 = (ulong)pairs.
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
      sVar6 = std::
              vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ::size(&this->message_generators_), uVar5 < sVar6;
      pairs.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           pairs.
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    ppMVar7 = std::
              vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ::operator[](&this->message_generators_,
                           (long)pairs.
                                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    MessageGenerator::GenerateParseTable
              (*ppMVar7,(Printer *)
                        entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,aux_offset,sStack_90);
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&count,
                        (long)pairs.
                              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    aux_offset = *pvVar8 + aux_offset;
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_70,
                        (long)pairs.
                              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    sStack_90 = *pvVar8 + sStack_90;
  }
  bVar2 = std::
          vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
          ::empty(&this->message_generators_);
  if (bVar2) {
    io::Printer::Print((Printer *)
                       entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                       "{ NULL, NULL, 0, -1, -1, false },\n");
  }
  io::Printer::Outdent
            ((Printer *)
             entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  io::Printer::Print((Printer *)
                     entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,"};\n\n");
  bVar2 = HasDescriptorMethods(this->file_,&this->options_);
  if (bVar2) {
    bVar2 = std::
            vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
            ::empty(&this->message_generators_);
    if (bVar2) {
      io::Printer::Print((Printer *)
                         entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                         "const ::google::protobuf::uint32 TableStruct::offsets[] = { ~0u };\nstatic const ::google::protobuf::internal::MigrationSchema* schemas = NULL;\nstatic const ::google::protobuf::Message* const* file_default_instances = NULL;\n"
                        );
    }
    else {
      io::Printer::Print((Printer *)
                         entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                         "const ::google::protobuf::uint32 TableStruct::offsets[] = {\n");
      io::Printer::Indent((Printer *)
                          entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                *)local_b0);
      local_b4 = 0;
      while( true ) {
        uVar5 = (ulong)local_b4;
        sVar6 = std::
                vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ::size(&this->message_generators_);
        if (sVar6 <= uVar5) break;
        ppMVar7 = std::
                  vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                  ::operator[](&this->message_generators_,(long)local_b4);
        pVar15 = MessageGenerator::GenerateOffsets
                           (*ppMVar7,(Printer *)
                                     entries.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        _i_4 = pVar15;
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::push_back((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     *)local_b0,(value_type *)&i_4);
        local_b4 = local_b4 + 1;
      }
      io::Printer::Outdent
                ((Printer *)
                 entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      io::Printer::Print((Printer *)
                         entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                         "};\n\nstatic const ::google::protobuf::internal::MigrationSchema schemas[] = {\n"
                        );
      io::Printer::Indent((Printer *)
                          entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      i_5 = 0;
      local_d0 = 0;
      while( true ) {
        sVar6 = std::
                vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ::size(&this->message_generators_);
        if (sVar6 <= (ulong)(long)local_d0) break;
        ppMVar7 = std::
                  vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                  ::operator[](&this->message_generators_,(long)local_d0);
        puVar1 = entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        this_00 = *ppMVar7;
        pvVar9 = std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                               *)local_b0,(long)local_d0);
        MessageGenerator::GenerateSchema(this_00,(Printer *)puVar1,i_5,(int)pvVar9->second);
        pvVar9 = std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                               *)local_b0,(long)local_d0);
        i_5 = i_5 + (int)pvVar9->first;
        local_d0 = local_d0 + 1;
      }
      io::Printer::Outdent
                ((Printer *)
                 entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      io::Printer::Print((Printer *)
                         entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                         "};\n\nstatic ::google::protobuf::Message const * const file_default_instances[] = {\n"
                        );
      io::Printer::Indent((Printer *)
                          entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      descriptor._4_4_ = 0;
      while( true ) {
        sVar6 = std::
                vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ::size(&this->message_generators_);
        if (sVar6 <= (ulong)(long)descriptor._4_4_) break;
        ppMVar7 = std::
                  vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                  ::operator[](&this->message_generators_,(long)descriptor._4_4_);
        puVar1 = entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        ClassName_abi_cxx11_
                  ((string *)((long)&message_factory.field_2 + 8),(cpp *)(*ppMVar7)->descriptor_,
                   (Descriptor *)0x0,SUB81(sVar6,0));
        io::Printer::Print((Printer *)puVar1,
                           "reinterpret_cast<const ::google::protobuf::Message*>(&_$classname$_default_instance_),\n"
                           ,"classname",(string *)((long)&message_factory.field_2 + 8));
        std::__cxx11::string::~string((string *)(message_factory.field_2._M_local_buf + 8));
        descriptor._4_4_ = descriptor._4_4_ + 1;
      }
      io::Printer::Outdent
                ((Printer *)
                 entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      io::Printer::Print((Printer *)
                         entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,"};\n\n");
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)local_b0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_120,"NULL",&local_121);
    std::allocator<char>::~allocator(&local_121);
    puVar1 = entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    psVar11 = FileDescriptor::name_abi_cxx11_(this->file_);
    bVar2 = std::
            vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
            ::empty(&this->message_generators_);
    pcVar10 = "file_level_metadata";
    if (bVar2) {
      pcVar10 = "NULL";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,pcVar10,&local_149);
    bVar2 = std::
            vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
            ::empty(&this->enum_generators_);
    pcVar10 = "file_level_enum_descriptors";
    if (bVar2) {
      pcVar10 = "NULL";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,pcVar10,&local_171);
    bVar3 = HasGenericServices(this->file_,&this->options_);
    bVar2 = false;
    if (bVar3) {
      iVar4 = FileDescriptor::service_count(this->file_);
      bVar2 = 0 < iVar4;
    }
    pcVar10 = "NULL";
    if (bVar2) {
      pcVar10 = "file_level_service_descriptors";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&i_6,pcVar10,&local_199);
    io::Printer::Print((Printer *)puVar1,
                       "namespace {\n\nvoid protobuf_AssignDescriptors() {\n  AddDescriptors();\n  ::google::protobuf::MessageFactory* factory = $factory$;\n  AssignDescriptors(\n      \"$filename$\", schemas, file_default_instances, TableStruct::offsets, factory,\n      $metadata$, $enum_descriptors$, $service_descriptors$);\n"
                       ,"filename",psVar11,"metadata",&local_148,"enum_descriptors",&local_170,
                       "service_descriptors",(string *)&i_6,"factory",(string *)local_120);
    std::__cxx11::string::~string((string *)&i_6);
    std::allocator<char>::~allocator(&local_199);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
    local_1a0 = 0;
    while( true ) {
      uVar5 = (ulong)(int)local_1a0;
      sVar6 = std::
              vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ::size(&this->message_generators_);
      puVar1 = entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (sVar6 <= uVar5) break;
      ppMVar7 = std::
                vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ::operator[](&this->message_generators_,(long)(int)local_1a0);
      qualified = (undefined1)sVar6;
      bVar2 = IsMapEntryMessage((*ppMVar7)->descriptor_);
      puVar1 = entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (bVar2) {
        SimpleItoa_abi_cxx11_(&local_1c0,(protobuf *)(ulong)local_1a0,i_16);
        ppMVar7 = std::
                  vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                  ::operator[](&this->message_generators_,(long)(int)local_1a0);
        this_01 = Descriptor::containing_type((*ppMVar7)->descriptor_);
        ClassName_abi_cxx11_(&local_1e0,(cpp *)this_01,(Descriptor *)0x0,(bool)qualified);
        ppMVar7 = std::
                  vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                  ::operator[](&this->message_generators_,(long)(int)local_1a0);
        ClassName_abi_cxx11_
                  (&local_200,(cpp *)(*ppMVar7)->descriptor_,(Descriptor *)0x0,(bool)qualified);
        io::Printer::Print((Printer *)puVar1,
                           "file_level_metadata[$index$].reflection = $parent$::$classname$::CreateReflection(file_level_metadata[$index$].descriptor, _$classname$_default_instance_.get_mutable());\n"
                           ,"index",&local_1c0,"parent",&local_1e0,"classname",&local_200);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_1c0);
      }
      local_1a0 = local_1a0 + 1;
    }
    psVar11 = FileDescriptor::name_abi_cxx11_(this->file_);
    bVar2 = std::
            vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
            ::empty(&this->message_generators_);
    pcVar10 = "file_level_metadata";
    if (bVar2) {
      pcVar10 = "NULL";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,pcVar10,&local_221);
    bVar2 = std::
            vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
            ::empty(&this->enum_generators_);
    pcVar10 = "file_level_enum_descriptors";
    if (bVar2) {
      pcVar10 = "NULL";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,pcVar10,&local_249);
    bVar3 = HasGenericServices(this->file_,&this->options_);
    bVar2 = false;
    if (bVar3) {
      iVar4 = FileDescriptor::service_count(this->file_);
      bVar2 = 0 < iVar4;
    }
    pcVar10 = "NULL";
    if (bVar2) {
      pcVar10 = "file_level_service_descriptors";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,pcVar10,&local_271);
    io::Printer::Print((Printer *)puVar1,
                       "}\n\nvoid protobuf_AssignDescriptorsOnce() {\n  static GOOGLE_PROTOBUF_DECLARE_ONCE(once);\n  ::google::protobuf::GoogleOnceInit(&once, &protobuf_AssignDescriptors);\n}\n\n"
                       ,"filename",psVar11,"metadata",&local_220,"enum_descriptors",&local_248,
                       "service_descriptors",&local_270,"factory",(string *)local_120);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
    io::Printer::Print((Printer *)
                       entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                       "void protobuf_RegisterTypes(const ::std::string&) GOOGLE_ATTRIBUTE_COLD;\nvoid protobuf_RegisterTypes(const ::std::string&) {\n  protobuf_AssignDescriptorsOnce();\n"
                      );
    io::Printer::Indent((Printer *)
                        entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = std::
            vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
            ::empty(&this->message_generators_);
    puVar1 = entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (!bVar2) {
      this_02 = (protobuf *)
                std::
                vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ::size(&this->message_generators_);
      SimpleItoa_abi_cxx11_((string *)&i_8,this_02,i_18);
      io::Printer::Print((Printer *)puVar1,
                         "::google::protobuf::internal::RegisterAllTypes(file_level_metadata, $size$);\n"
                         ,"size",(string *)&i_8);
      std::__cxx11::string::~string((string *)&i_8);
    }
    io::Printer::Outdent
              ((Printer *)
               entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    io::Printer::Print((Printer *)
                       entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,"}\n\n}  // namespace\n");
    std::__cxx11::string::~string((string *)local_120);
  }
  io::Printer::Print((Printer *)
                     entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                     "\nvoid TableStruct::Shutdown() {\n");
  io::Printer::Indent((Printer *)
                      entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_29c = 0;
  while( true ) {
    uVar5 = (ulong)local_29c;
    sVar6 = std::
            vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
            ::size(&this->message_generators_);
    if (sVar6 <= uVar5) break;
    ppMVar7 = std::
              vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ::operator[](&this->message_generators_,(long)local_29c);
    MessageGenerator::GenerateShutdownCode
              (*ppMVar7,(Printer *)
                        entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_29c = local_29c + 1;
  }
  bVar2 = HasDescriptorMethods(this->file_,&this->options_);
  if (bVar2) {
    local_2a0 = 0;
    while( true ) {
      uVar5 = (ulong)(int)local_2a0;
      sVar6 = std::
              vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ::size(&this->message_generators_);
      if (sVar6 <= uVar5) break;
      ppMVar7 = std::
                vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ::operator[](&this->message_generators_,(long)(int)local_2a0);
      bVar2 = IsMapEntryMessage((*ppMVar7)->descriptor_);
      puVar1 = entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (bVar2) {
        SimpleItoa_abi_cxx11_((string *)local_2c0,(protobuf *)(ulong)local_2a0,i_17);
        io::Printer::Print((Printer *)puVar1,"delete file_level_metadata[$index$].reflection;\n",
                           "index",(string *)local_2c0);
        std::__cxx11::string::~string((string *)local_2c0);
      }
      local_2a0 = local_2a0 + 1;
    }
  }
  io::Printer::Outdent
            ((Printer *)
             entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  io::Printer::Print((Printer *)
                     entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,"}\n\n");
  io::Printer::Print((Printer *)
                     entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                     "void TableStruct::InitDefaultsImpl() {\n  GOOGLE_PROTOBUF_VERIFY_VERSION;\n\n  ::google::protobuf::internal::InitProtobufDefaults();\n"
                    );
  io::Printer::Indent((Printer *)
                      entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  dependency._4_4_ = 0;
  while( true ) {
    iVar4 = FileDescriptor::dependency_count(this->file_);
    if (iVar4 <= dependency._4_4_) break;
    file_namespace.field_2._8_8_ = FileDescriptor::dependency(this->file_,dependency._4_4_);
    psVar11 = FileDescriptor::package_abi_cxx11_((FileDescriptor *)file_namespace.field_2._8_8_);
    psVar12 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)file_namespace.field_2._8_8_);
    FileLevelNamespace((string *)&i_11,psVar12);
    QualifiedFileLevelSymbol((string *)local_2f0,psVar11,(string *)&i_11);
    std::__cxx11::string::~string((string *)&i_11);
    io::Printer::Print((Printer *)
                       entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                       "$file_namespace$::InitDefaults();\n","file_namespace",(string *)local_2f0);
    std::__cxx11::string::~string((string *)local_2f0);
    dependency._4_4_ = dependency._4_4_ + 1;
  }
  i_12 = 0;
  while( true ) {
    sVar6 = std::
            vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
            ::size(&this->message_generators_);
    if (sVar6 <= (ulong)(long)i_12) break;
    ppMVar7 = std::
              vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ::operator[](&this->message_generators_,(long)i_12);
    MessageGenerator::GenerateDefaultInstanceAllocator
              (*ppMVar7,(Printer *)
                        entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    i_12 = i_12 + 1;
  }
  local_318 = 0;
  while( true ) {
    sVar6 = std::
            vector<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
            ::size(&this->extension_generators_);
    if (sVar6 <= (ulong)(long)local_318) break;
    ppEVar13 = std::
               vector<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
               ::operator[](&this->extension_generators_,(long)local_318);
    ExtensionGenerator::GenerateRegistration
              (*ppEVar13,
               (Printer *)
               entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    local_318 = local_318 + 1;
  }
  file_proto.source_code_info_._4_4_ = 0;
  while( true ) {
    sVar6 = std::
            vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
            ::size(&this->message_generators_);
    if (sVar6 <= (ulong)(long)file_proto.source_code_info_._4_4_) break;
    ppMVar7 = std::
              vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ::operator[](&this->message_generators_,(long)file_proto.source_code_info_._4_4_);
    MessageGenerator::GenerateDefaultInstanceInitializer
              (*ppMVar7,(Printer *)
                        entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    file_proto.source_code_info_._4_4_ = file_proto.source_code_info_._4_4_ + 1;
  }
  io::Printer::Outdent
            ((Printer *)
             entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  io::Printer::Print((Printer *)
                     entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                     "}\n\nvoid InitDefaults() {\n  static GOOGLE_PROTOBUF_DECLARE_ONCE(once);\n  ::google::protobuf::GoogleOnceInit(&once, &TableStruct::InitDefaultsImpl);\n}\n"
                    );
  io::Printer::Print((Printer *)
                     entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                     "void AddDescriptorsImpl() {\n  InitDefaults();\n");
  io::Printer::Indent((Printer *)
                      entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar2 = HasDescriptorMethods(this->file_,&this->options_);
  if (bVar2) {
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)((long)&file_data.field_2 + 8));
    FileDescriptor::CopyTo(this->file_,(FileDescriptorProto *)((long)&file_data.field_2 + 8));
    std::__cxx11::string::string((string *)&j);
    MessageLite::SerializeToString((MessageLite *)((long)&file_data.field_2 + 8),(string *)&j);
    io::Printer::Print((Printer *)
                       entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                       "static const char descriptor[] = {\n");
    io::Printer::Indent((Printer *)
                        entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    uVar5 = std::__cxx11::string::size();
    if (uVar5 < 0x103e8) {
      local_464 = 0;
      while( true ) {
        uVar5 = (ulong)local_464;
        uVar14 = std::__cxx11::string::size();
        puVar1 = entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (uVar14 <= uVar5) break;
        std::__cxx11::string::substr((ulong)&local_4c8,(ulong)&j);
        CEscape(&local_4a8,&local_4c8);
        EscapeTrigraphs(&local_488,&local_4a8);
        io::Printer::Print((Printer *)puVar1,"  \"$data$\"\n","data",&local_488);
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::__cxx11::string::~string((string *)&local_4c8);
        local_464 = local_464 + 0x28;
      }
    }
    else {
      local_41c = 0;
      while( true ) {
        uVar5 = (ulong)local_41c;
        uVar14 = std::__cxx11::string::size();
        if (uVar14 <= uVar5) break;
        local_420 = 0;
        while( true ) {
          bVar2 = false;
          if (local_420 < 0x19) {
            uVar5 = (ulong)local_41c;
            uVar14 = std::__cxx11::string::size();
            bVar2 = uVar5 < uVar14;
          }
          puVar1 = entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage;
          if (!bVar2) break;
          std::__cxx11::string::substr((ulong)local_460,(ulong)&j);
          CEscape(&local_440,(string *)local_460);
          io::Printer::Print((Printer *)puVar1,"\'$char$\', ","char",&local_440);
          std::__cxx11::string::~string((string *)&local_440);
          std::__cxx11::string::~string((string *)local_460);
          local_41c = local_41c + 1;
          local_420 = local_420 + 1;
        }
        io::Printer::Print((Printer *)
                           entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,"\n");
      }
    }
    io::Printer::Outdent
              ((Printer *)
               entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    io::Printer::Print((Printer *)
                       entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,"};\n");
    puVar1 = entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    auVar16 = std::__cxx11::string::size();
    SimpleItoa_abi_cxx11_((string *)local_4e8,auVar16._0_8_,auVar16._8_8_);
    io::Printer::Print((Printer *)puVar1,
                       "::google::protobuf::DescriptorPool::InternalAddGeneratedFile(\n    descriptor, $size$);\n"
                       ,"size",(string *)local_4e8);
    std::__cxx11::string::~string((string *)local_4e8);
    puVar1 = entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    psVar11 = FileDescriptor::name_abi_cxx11_(this->file_);
    io::Printer::Print((Printer *)puVar1,
                       "::google::protobuf::MessageFactory::InternalRegisterGeneratedFile(\n  \"$filename$\", &protobuf_RegisterTypes);\n"
                       ,"filename",psVar11);
    std::__cxx11::string::~string((string *)&j);
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)((long)&file_data.field_2 + 8))
    ;
  }
  dependency_1._4_4_ = 0;
  while( true ) {
    iVar4 = FileDescriptor::dependency_count(this->file_);
    if (iVar4 <= dependency_1._4_4_) break;
    file_namespace_1.field_2._8_8_ = FileDescriptor::dependency(this->file_,dependency_1._4_4_);
    psVar11 = FileDescriptor::package_abi_cxx11_((FileDescriptor *)file_namespace_1.field_2._8_8_);
    psVar12 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)file_namespace_1.field_2._8_8_);
    FileLevelNamespace(&local_538,psVar12);
    QualifiedFileLevelSymbol((string *)local_518,psVar11,&local_538);
    std::__cxx11::string::~string((string *)&local_538);
    io::Printer::Print((Printer *)
                       entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                       "$file_namespace$::AddDescriptors();\n","file_namespace",(string *)local_518)
    ;
    std::__cxx11::string::~string((string *)local_518);
    dependency_1._4_4_ = dependency_1._4_4_ + 1;
  }
  io::Printer::Print((Printer *)
                     entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                     "::google::protobuf::internal::OnShutdown(&TableStruct::Shutdown);\n");
  io::Printer::Outdent
            ((Printer *)
             entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  io::Printer::Print((Printer *)
                     entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                     "}\n\nvoid AddDescriptors() {\n  static GOOGLE_PROTOBUF_DECLARE_ONCE(once);\n  ::google::protobuf::GoogleOnceInit(&once, &AddDescriptorsImpl);\n}\n"
                    );
  bVar2 = StaticInitializersForced(this->file_,&this->options_);
  if (!bVar2) {
    io::Printer::Print((Printer *)
                       entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                       "#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n");
  }
  io::Printer::Print((Printer *)
                     entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                     "// Force AddDescriptors() to be called at static initialization time.\nstruct StaticDescriptorInitializer {\n  StaticDescriptorInitializer() {\n    AddDescriptors();\n  }\n} static_descriptor_initializer;\n"
                    );
  bVar2 = StaticInitializersForced(this->file_,&this->options_);
  if (!bVar2) {
    io::Printer::Print((Printer *)
                       entries.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                       "#endif  // GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n");
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_70);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&count);
  return;
}

Assistant:

void FileGenerator::GenerateBuildDescriptors(io::Printer* printer) {
  // AddDescriptors() is a file-level procedure which adds the encoded
  // FileDescriptorProto for this .proto file to the global DescriptorPool for
  // generated files (DescriptorPool::generated_pool()). It either runs at
  // static initialization time (by default) or when default_instance() is
  // called for the first time (in LITE_RUNTIME mode with
  // GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER flag enabled). This procedure also
  // constructs default instances and registers extensions.
  //
  // Its sibling, AssignDescriptors(), actually pulls the compiled
  // FileDescriptor from the DescriptorPool and uses it to populate all of
  // the global variables which store pointers to the descriptor objects.
  // It also constructs the reflection objects.  It is called the first time
  // anyone calls descriptor() or GetReflection() on one of the types defined
  // in the file.

  // In optimize_for = LITE_RUNTIME mode, we don't generate AssignDescriptors()
  // and we only use AddDescriptors() to allocate default instances.

  // TODO(ckennelly): Gate this with the same options flag to enable
  // table-driven parsing.

  printer->Print("PROTOBUF_CONSTEXPR_VAR ::google::protobuf::internal::ParseTableField\n"
                 "    const TableStruct::entries[] = {\n");
  printer->Indent();

  std::vector<size_t> entries;
  size_t count = 0;
  for (int i = 0; i < message_generators_.size(); i++) {
    size_t value = message_generators_[i]->GenerateParseOffsets(printer);
    entries.push_back(value);
    count += value;
  }

  // We need these arrays to exist, and MSVC does not like empty arrays.
  if (count == 0) {
    printer->Print("{0, 0, 0, ::google::protobuf::internal::kInvalidMask, 0, 0},\n");
  }

  printer->Outdent();
  printer->Print(
      "};\n"
      "\n"
      "PROTOBUF_CONSTEXPR_VAR ::google::protobuf::internal::AuxillaryParseTableField\n"
      "    const TableStruct::aux[] = {\n");
  printer->Indent();

  std::vector<size_t> aux_entries;
  count = 0;
  for (int i = 0; i < message_generators_.size(); i++) {
    size_t value = message_generators_[i]->GenerateParseAuxTable(printer);
    aux_entries.push_back(value);
    count += value;
  }

  if (count == 0) {
    printer->Print("::google::protobuf::internal::AuxillaryParseTableField(),\n");
  }

  printer->Outdent();
  printer->Print(
      "};\n"
      "PROTOBUF_CONSTEXPR_VAR ::google::protobuf::internal::ParseTable const\n"
      "    TableStruct::schema[] = {\n");
  printer->Indent();

  size_t offset = 0;
  size_t aux_offset = 0;
  for (int i = 0; i < message_generators_.size(); i++) {
    message_generators_[i]->GenerateParseTable(printer, offset, aux_offset);
    offset += entries[i];
    aux_offset += aux_entries[i];
  }

  if (message_generators_.empty()) {
    printer->Print("{ NULL, NULL, 0, -1, -1, false },\n");
  }

  printer->Outdent();
  printer->Print(
      "};\n"
      "\n");

  if (HasDescriptorMethods(file_, options_)) {
    if (!message_generators_.empty()) {
      printer->Print("const ::google::protobuf::uint32 TableStruct::offsets[] = {\n");
      printer->Indent();
      std::vector<std::pair<size_t, size_t> > pairs;
      for (int i = 0; i < message_generators_.size(); i++) {
        pairs.push_back(message_generators_[i]->GenerateOffsets(printer));
      }
      printer->Outdent();
      printer->Print(
          "};\n"
          "\n"
          "static const ::google::protobuf::internal::MigrationSchema schemas[] = {\n");
      printer->Indent();
      {
        int offset = 0;
        for (int i = 0; i < message_generators_.size(); i++) {
          message_generators_[i]->GenerateSchema(printer, offset,
                                                 pairs[i].second);
          offset += pairs[i].first;
        }
      }
      printer->Outdent();
      printer->Print(
          "};\n"
          "\nstatic "
          "::google::protobuf::Message const * const file_default_instances[] = {\n");
      printer->Indent();
      for (int i = 0; i < message_generators_.size(); i++) {
        const Descriptor* descriptor = message_generators_[i]->descriptor_;
        printer->Print(
            "reinterpret_cast<const "
            "::google::protobuf::Message*>(&_$classname$_default_instance_),\n",
            "classname", ClassName(descriptor, false));
      }
      printer->Outdent();
      printer->Print(
          "};\n"
          "\n");
    } else {
      // we still need these symbols to exist
      printer->Print(
          // MSVC doesn't like empty arrays, so we add a dummy.
          "const ::google::protobuf::uint32 TableStruct::offsets[] = { ~0u };\n"
          "static const ::google::protobuf::internal::MigrationSchema* schemas = NULL;\n"
          "static const ::google::protobuf::Message* const* "
          "file_default_instances = NULL;\n");
    }

    // ---------------------------------------------------------------

    // protobuf_AssignDescriptorsOnce():  The first time it is called, calls
    // AssignDescriptors().  All later times, waits for the first call to
    // complete and then returns.
    string message_factory = "NULL";
    printer->Print(
        "namespace {\n"
        "\n"
        "void protobuf_AssignDescriptors() {\n"
        // Make sure the file has found its way into the pool.  If a descriptor
        // is requested *during* static init then AddDescriptors() may not have
        // been called yet, so we call it manually.  Note that it's fine if
        // AddDescriptors() is called multiple times.
        "  AddDescriptors();\n"
        "  ::google::protobuf::MessageFactory* factory = $factory$;\n"
        "  AssignDescriptors(\n"
        "      \"$filename$\", schemas, file_default_instances, "
        "TableStruct::offsets, factory,\n"
        "      $metadata$, $enum_descriptors$, $service_descriptors$);\n",
        "filename", file_->name(), "metadata",
        !message_generators_.empty() ? "file_level_metadata" : "NULL",
        "enum_descriptors",
        !enum_generators_.empty() ? "file_level_enum_descriptors" : "NULL",
        "service_descriptors",
        HasGenericServices(file_, options_) && file_->service_count() > 0
            ? "file_level_service_descriptors"
            : "NULL",
        "factory", message_factory);
    // TODO(gerbens) have the compiler include the schemas for map types
    // so that this can go away, and we can potentially use table driven
    // serialization for map types as well.
    for (int i = 0; i < message_generators_.size(); i++) {
      if (!IsMapEntryMessage(message_generators_[i]->descriptor_)) continue;
      printer->Print(
          "file_level_metadata[$index$].reflection = "
          "$parent$::$classname$::CreateReflection(file_level_metadata[$index$]"
          ".descriptor, _$classname$_default_instance_.get_mutable());\n",
          "index", SimpleItoa(i), "parent",
          ClassName(message_generators_[i]->descriptor_->containing_type(),
                    false),
          "classname", ClassName(message_generators_[i]->descriptor_, false));
    }
    printer->Print(
        "}\n"
        "\n"
        "void protobuf_AssignDescriptorsOnce() {\n"
        "  static GOOGLE_PROTOBUF_DECLARE_ONCE(once);\n"
        "  ::google::protobuf::GoogleOnceInit(&once, &protobuf_AssignDescriptors);\n"
        "}\n"
        "\n",
        "filename", file_->name(), "metadata",
        !message_generators_.empty() ? "file_level_metadata" : "NULL",
        "enum_descriptors",
        !enum_generators_.empty() ? "file_level_enum_descriptors" : "NULL",
        "service_descriptors",
        HasGenericServices(file_, options_) && file_->service_count() > 0
            ? "file_level_service_descriptors"
            : "NULL",
        "factory", message_factory);

    // Only here because of useless string reference that we don't want in
    // protobuf_AssignDescriptorsOnce, because that is called from all the
    // GetMetadata member methods.
    printer->Print(
        "void protobuf_RegisterTypes(const ::std::string&) GOOGLE_ATTRIBUTE_COLD;\n"
        "void protobuf_RegisterTypes(const ::std::string&) {\n"
        "  protobuf_AssignDescriptorsOnce();\n");
    printer->Indent();

    // All normal messages can be done generically
    if (!message_generators_.empty()) {
      printer->Print(
        "::google::protobuf::internal::RegisterAllTypes(file_level_metadata, $size$);\n",
        "size", SimpleItoa(message_generators_.size()));
    }

    printer->Outdent();
    printer->Print(
      "}\n"
      "\n"
      "}  // namespace\n");
  }

  // -----------------------------------------------------------------

  // ShutdownFile():  Deletes descriptors, default instances, etc. on shutdown.
  printer->Print(
    "\n"
    "void TableStruct::Shutdown() {\n");
  printer->Indent();

  for (int i = 0; i < message_generators_.size(); i++) {
    message_generators_[i]->GenerateShutdownCode(printer);
  }

  if (HasDescriptorMethods(file_, options_)) {
    for (int i = 0; i < message_generators_.size(); i++) {
      if (!IsMapEntryMessage(message_generators_[i]->descriptor_)) continue;
      printer->Print(
          "delete file_level_metadata[$index$].reflection;\n",
          "index", SimpleItoa(i));
    }
  }

  printer->Outdent();
  printer->Print(
    "}\n\n");

  // -----------------------------------------------------------------

  // Now generate the InitDefaultsImpl() function.
  printer->Print(
      "void TableStruct::InitDefaultsImpl() {\n"
      "  GOOGLE_PROTOBUF_VERIFY_VERSION;\n\n"
      // Force initialization of primitive values we depend on.
      "  ::google::protobuf::internal::InitProtobufDefaults();\n");

  printer->Indent();

  // Call the InitDefaults() methods for all of our dependencies, to make
  // sure they get added first.
  for (int i = 0; i < file_->dependency_count(); i++) {
    const FileDescriptor* dependency = file_->dependency(i);
    // Print the namespace prefix for the dependency.
    string file_namespace = QualifiedFileLevelSymbol(
        dependency->package(), FileLevelNamespace(dependency->name()));
    // Call its AddDescriptors function.
    printer->Print("$file_namespace$::InitDefaults();\n", "file_namespace",
                   file_namespace);
  }

  // Allocate and initialize default instances.  This can't be done lazily
  // since default instances are returned by simple accessors and are used with
  // extensions.  Speaking of which, we also register extensions at this time.
  for (int i = 0; i < message_generators_.size(); i++) {
    message_generators_[i]->GenerateDefaultInstanceAllocator(printer);
  }
  for (int i = 0; i < extension_generators_.size(); i++) {
    extension_generators_[i]->GenerateRegistration(printer);
  }
  for (int i = 0; i < message_generators_.size(); i++) {
    message_generators_[i]->GenerateDefaultInstanceInitializer(printer);
  }
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n"
      "void InitDefaults() {\n"
      "  static GOOGLE_PROTOBUF_DECLARE_ONCE(once);\n"
      "  ::google::protobuf::GoogleOnceInit(&once, &TableStruct::InitDefaultsImpl);\n"
      "}\n");

  // -----------------------------------------------------------------

  // Now generate the AddDescriptors() function.
  printer->Print(
      "void AddDescriptorsImpl() {\n"
      "  InitDefaults();\n");

  printer->Indent();
  if (HasDescriptorMethods(file_, options_)) {
    // Embed the descriptor.  We simply serialize the entire
    // FileDescriptorProto
    // and embed it as a string literal, which is parsed and built into real
    // descriptors at initialization time.
    FileDescriptorProto file_proto;
    file_->CopyTo(&file_proto);
    string file_data;
    file_proto.SerializeToString(&file_data);

    printer->Print("static const char descriptor[] = {\n");
    printer->Indent();

    if (file_data.size() > 66535) {
      // Workaround for MSVC: "Error C1091: compiler limit: string exceeds 65535
      // bytes in length". Declare a static array of characters rather than use
      // a string literal. Only write 25 bytes per line.
      static const int kBytesPerLine = 25;
      for (int i = 0; i < file_data.size();) {
        for (int j = 0; j < kBytesPerLine && i < file_data.size(); ++i, ++j) {
          printer->Print("'$char$', ", "char",
                         CEscape(file_data.substr(i, 1)));
        }
        printer->Print("\n");
      }
    } else {
      // Only write 40 bytes per line.
      static const int kBytesPerLine = 40;
      for (int i = 0; i < file_data.size(); i += kBytesPerLine) {
        printer->Print("  \"$data$\"\n", "data",
                       EscapeTrigraphs(CEscape(
                           file_data.substr(i, kBytesPerLine))));
      }
    }

    printer->Outdent();
    printer->Print("};\n");
    printer->Print(
        "::google::protobuf::DescriptorPool::InternalAddGeneratedFile(\n"
        "    descriptor, $size$);\n",
        "size", SimpleItoa(file_data.size()));

    // Call MessageFactory::InternalRegisterGeneratedFile().
    printer->Print(
      "::google::protobuf::MessageFactory::InternalRegisterGeneratedFile(\n"
      "  \"$filename$\", &protobuf_RegisterTypes);\n",
      "filename", file_->name());
  }

  // Call the AddDescriptors() methods for all of our dependencies, to make
  // sure they get added first.
  for (int i = 0; i < file_->dependency_count(); i++) {
    const FileDescriptor* dependency = file_->dependency(i);
    // Print the namespace prefix for the dependency.
    string file_namespace = QualifiedFileLevelSymbol(
        dependency->package(), FileLevelNamespace(dependency->name()));
    // Call its AddDescriptors function.
    printer->Print("$file_namespace$::AddDescriptors();\n", "file_namespace",
                   file_namespace);
  }

  printer->Print(
      "::google::protobuf::internal::OnShutdown(&TableStruct::Shutdown);\n");

  printer->Outdent();
  printer->Print(
      "}\n"
      "\n"
      "void AddDescriptors() {\n"
      "  static GOOGLE_PROTOBUF_DECLARE_ONCE(once);\n"
      "  ::google::protobuf::GoogleOnceInit(&once, &AddDescriptorsImpl);\n"
      "}\n");

  if (!StaticInitializersForced(file_, options_)) {
    printer->Print("#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n");
  }
  printer->Print(
      // With static initializers.
      "// Force AddDescriptors() to be called at static initialization time.\n"
      "struct StaticDescriptorInitializer {\n"
      "  StaticDescriptorInitializer() {\n"
      "    AddDescriptors();\n"
      "  }\n"
      "} static_descriptor_initializer;\n");
  if (!StaticInitializersForced(file_, options_)) {
    printer->Print("#endif  // GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n");
  }
}